

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICache.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_72eb97::Cache::DumpEntry(Value *__return_storage_ptr__,Cache *this,string *name)

{
  bool bVar1;
  CacheEntryType type;
  Value *pVVar2;
  char *pcVar3;
  Value local_100;
  undefined1 local_d8 [8];
  Value properties;
  Value local_88;
  Value local_50;
  byte local_21;
  string *local_20;
  string *name_local;
  Cache *this_local;
  Value *entry;
  
  local_21 = 0;
  local_20 = name;
  name_local = (string *)this;
  this_local = (Cache *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_50,local_20);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar2,&local_50);
  Json::Value::~Value(&local_50);
  type = cmState::GetCacheEntryType(this->State,local_20);
  pcVar3 = cmState::CacheEntryTypeToString(type);
  Json::Value::Value(&local_88,pcVar3);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"type");
  Json::Value::operator=(pVVar2,&local_88);
  Json::Value::~Value(&local_88);
  pcVar3 = cmState::GetCacheEntryValue(this->State,local_20);
  Json::Value::Value((Value *)&properties.limit_,pcVar3);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"value");
  Json::Value::operator=(pVVar2,(Value *)&properties.limit_);
  Json::Value::~Value((Value *)&properties.limit_);
  DumpEntryProperties((Value *)local_d8,this,local_20);
  bVar1 = Json::Value::empty((Value *)local_d8);
  if (!bVar1) {
    Json::Value::Value(&local_100,(Value *)local_d8);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"properties");
    Json::Value::operator=(pVVar2,&local_100);
    Json::Value::~Value(&local_100);
  }
  local_21 = 1;
  Json::Value::~Value((Value *)local_d8);
  if ((local_21 & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Cache::DumpEntry(std::string const& name)
{
  Json::Value entry = Json::objectValue;
  entry["name"] = name;
  entry["type"] =
    cmState::CacheEntryTypeToString(this->State->GetCacheEntryType(name));
  entry["value"] = this->State->GetCacheEntryValue(name);

  Json::Value properties = this->DumpEntryProperties(name);
  if (!properties.empty()) {
    entry["properties"] = std::move(properties);
  }

  return entry;
}